

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::RTS(m6502 *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  m6502 *this_local;
  
  this->stackPointer = this->stackPointer + '\x01';
  sVar1 = read(this,this->stackPointer + 0x100,(void *)0x0,in_RCX);
  this->pc = (ushort)sVar1 & 0xff;
  this->stackPointer = this->stackPointer + '\x01';
  sVar1 = read(this,this->stackPointer + 0x100,(void *)0x0,in_RCX);
  this->pc = this->pc | (ushort)(byte)sVar1 << 8;
  this->pc = this->pc + 1;
  return '\0';
}

Assistant:

uint8_t RTS()
  {
    ++stackPointer;
    pc = read(0x0100u + stackPointer);
    ++stackPointer;
    pc |= (uint16_t)read(0x0100u + stackPointer) << 8;

    ++pc;
    return 0;
  }